

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree_iterators.h
# Opt level: O2

void __thiscall
Gudhi::
Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>
::Simplex_tree_complex_simplex_iterator
          (Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>
           *this,Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *st)

{
  Siblings *pSVar1;
  pointer ppVar2;
  
  (this->sh_).m_ptr =
       (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>
        *)0x0;
  this->sib_ = (Siblings *)0x0;
  this->st_ = st;
  if ((st == (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *)0x0) ||
     ((st->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 0)) {
    this->st_ = (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *)0x0;
  }
  else {
    ppVar2 = (st->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_start;
    (this->sh_).m_ptr =
         (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>
          *)ppVar2;
    this->sib_ = &st->root_;
    while (pSVar1 = (ppVar2->second).children_, pSVar1->parent_ == ppVar2->first) {
      this->sib_ = pSVar1;
      ppVar2 = (pSVar1->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
      (this->sh_).m_ptr =
           (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>
            *)ppVar2;
    }
  }
  return;
}

Assistant:

explicit Simplex_tree_complex_simplex_iterator(SimplexTree const* st)
      : sib_(nullptr),
        st_(st) {
    if (st == nullptr || st->root() == nullptr || st->root()->members().empty()) {
      st_ = nullptr;
    } else {
      sh_ = st->root()->members().begin();
      sib_ = st->root();
      while (st->has_children(sh_)) {
        sib_ = sh_->second.children();
        sh_ = sib_->members().begin();
      }
    }
  }